

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  ImVec2 IVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImU32 col;
  ImU32 col_00;
  int iVar5;
  int idx;
  float fVar6;
  float fVar7;
  ImVec2 pos_00;
  bool held;
  bool hovered;
  ImVec2 center;
  ImRect bb;
  
  pIVar2 = GImGui;
  window = GImGui->CurrentWindow;
  IVar1 = (GImGui->Style).FramePadding;
  fVar6 = IVar1.x;
  fVar7 = IVar1.y;
  bb.Max.x = fVar6 + fVar6 + GImGui->FontSize + (*pos).x;
  bb.Max.y = fVar7 + fVar7 + GImGui->FontSize + (*pos).y;
  bb.Min = *pos;
  ItemAdd(&bb,id,(ImRect *)0x0);
  bVar3 = ButtonBehavior(&bb,id,&hovered,&held,0);
  iVar5 = ((held ^ 1U) & hovered) + 0x15;
  idx = 0x17;
  if ((hovered & 1U) == 0) {
    idx = iVar5;
  }
  if (held == false) {
    idx = iVar5;
  }
  col = GetColorU32(idx,1.0);
  col_00 = GetColorU32(0,1.0);
  center.x = (bb.Max.x + bb.Min.x) * 0.5;
  center.y = (bb.Max.y + bb.Min.y) * 0.5;
  if ((hovered != false) || (held == true)) {
    ImDrawList::AddCircleFilled(window->DrawList,&center,pIVar2->FontSize * 0.5 + 1.0,col,0xc);
  }
  IVar1 = (pIVar2->Style).FramePadding;
  pos_00.x = IVar1.x + bb.Min.x;
  pos_00.y = IVar1.y + bb.Min.y;
  RenderArrow(window->DrawList,pos_00,col_00,(window->Collapsed ^ 1) * 2 + 1,1.0);
  bVar4 = IsItemActive();
  if (bVar4) {
    bVar4 = IsMouseDragging(0,-1.0);
    if (bVar4) {
      StartMouseMovingWindow(window);
    }
  }
  return bVar3;
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImVec2 center = bb.GetCenter();
    if (hovered || held)
        window->DrawList->AddCircleFilled(center/*+ ImVec2(0.0f, -0.5f)*/, g.FontSize * 0.5f + 1.0f, bg_col, 12);
    RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindow(window);

    return pressed;
}